

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttdriver.c
# Opt level: O2

FT_Error tt_glyph_load(FT_GlyphSlot ttslot,FT_Size ttsize,FT_UInt glyph_index,FT_Int32 load_flags)

{
  FT_Outline *outline;
  byte *pbVar1;
  int *piVar2;
  short *psVar3;
  TT_Face face;
  void *pvVar4;
  long *plVar5;
  FT_Vector *pFVar6;
  FT_Pos FVar7;
  FT_Fixed FVar8;
  undefined4 uVar9;
  short sVar10;
  short sVar11;
  int iVar12;
  FT_Error FVar13;
  uint uVar14;
  ulong uVar15;
  FT_Face pFVar16;
  FT_Long b_;
  FT_Long FVar17;
  long lVar18;
  long lVar19;
  FT_BBox *pFVar20;
  short *psVar21;
  FT_Pos *pFVar22;
  FT_Fixed FVar23;
  bool bVar24;
  int local_210;
  FT_UShort advance_height;
  FT_Fixed local_200;
  FT_Short top_bearing;
  long lStack_1f0;
  long local_1e8;
  long lStack_1e0;
  FT_UShort advance_width;
  FT_Fixed local_1c8;
  ulong local_1c0;
  TT_LoaderRec loader;
  
  if (ttsize == (FT_Size)0x0) {
    return 0x24;
  }
  face = (TT_Face)ttslot->face;
  if (face == (TT_Face)0x0) {
    return 0x23;
  }
  if (((uint)(face->root).num_glyphs <= glyph_index) &&
     (((face->root).internal)->incremental_interface == (FT_Incremental_InterfaceRec *)0x0)) {
    return 6;
  }
  if ((load_flags & 2U) != 0) {
    uVar15 = (ulong)(load_flags & 0xfffffffd);
    if (((face->root).face_flags & 0x2000) == 0) {
      uVar15 = (ulong)(uint)load_flags;
    }
    load_flags = (uint)(uVar15 >> 0xe) & 2 | (uint)uVar15;
  }
  if ((load_flags & 0x401U) != 0) {
    load_flags = (uint)(((face->root).face_flags & 0x2000) == 0) * 2 | load_flags | 9;
  }
  pFVar16 = (FT_Face)&ttsize->metrics;
  if ((load_flags & 2U) == 0) {
    pFVar16 = (FT_Face)&ttsize[1].generic;
  }
  ttsize[1].face = pFVar16;
  lVar18 = ttsize[2].metrics.height;
  if ((((char)((load_flags & 8U) >> 3) == '\0' && lVar18 != 0xffffffff) &&
      (((face->root).face_index & 0x7fff0000) == 0)) && (((face->root).face_flags & 0x8000) == 0)) {
    local_200 = (ttsize->metrics).x_scale;
    FVar23 = (ttsize->metrics).y_scale;
    iVar12 = (**(code **)((long)face->sfnt + 0x90))
                       (face,lVar18,glyph_index,load_flags,(face->root).stream,&ttslot->bitmap,
                        &loader);
    local_210 = (int)FVar23;
    if (iVar12 == 0) {
      (ttslot->outline).n_contours = 0;
      (ttslot->outline).n_points = 0;
      (ttslot->metrics).width = (ulong)loader.face._2_2_ << 6;
      (ttslot->metrics).height = (ulong)(ushort)loader.face << 6;
      (ttslot->metrics).horiBearingX = (long)loader.face._4_2_ << 6;
      (ttslot->metrics).horiBearingY = (long)loader.face._6_2_ << 6;
      (ttslot->metrics).horiAdvance = (ulong)(ushort)loader.size << 6;
      (ttslot->metrics).vertBearingX = (long)loader.size._2_2_ << 6;
      (ttslot->metrics).vertBearingY = (long)loader.size._4_2_ << 6;
      (ttslot->metrics).vertAdvance = (ulong)loader.size._6_2_ << 6;
      bVar24 = (load_flags & 0x10U) == 0;
      if (bVar24) {
        loader.size._2_2_ = loader.face._4_2_;
      }
      ttslot->format = FT_GLYPH_FORMAT_BITMAP;
      if (bVar24) {
        loader.size._4_2_ = loader.face._6_2_;
      }
      ttslot->bitmap_left = (int)loader.size._2_2_;
      ttslot->bitmap_top = (int)loader.size._4_2_;
      if ((ttslot->face->face_flags & 0x20001) == 0) {
        return 0;
      }
      tt_loader_init(&loader,(TT_Size)ttsize,ttslot,load_flags,'\x01');
      load_truetype_glyph(&loader,glyph_index,0,'\x01');
      tt_loader_done(&loader);
      ttslot->linearHoriAdvance = (long)loader.linear;
      ttslot->linearVertAdvance = (long)loader.vadvance;
      if ((face->sbit_table_type == TT_SBIT_TABLE_TYPE_SBIX) && (0 < loader.n_contours)) {
        bVar24 = (load_flags & 0x10U) != 0;
        pFVar20 = (FT_BBox *)&loader.left_bearing;
        if (bVar24) {
          pFVar20 = &loader.bbox;
        }
        pFVar22 = &loader.bbox.yMin;
        if (bVar24) {
          pFVar22 = (FT_Pos *)&loader.top_bearing;
        }
        FVar7 = *pFVar22;
        lVar18 = (long)(int)local_200 * (long)(int)pFVar20->xMin;
        ttslot->bitmap_left =
             ttslot->bitmap_left + ((int)((ulong)(lVar18 + 0x8000 + (lVar18 >> 0x3f)) >> 0x10) >> 6)
        ;
        lVar18 = (long)local_210 * (long)(int)FVar7;
        ttslot->bitmap_top =
             ttslot->bitmap_top + ((int)((ulong)(lVar18 + 0x8000 + (lVar18 >> 0x3f)) >> 0x10) >> 6);
      }
      if (((ttslot->metrics).horiAdvance == 0) && (loader.linear != 0)) {
        lVar18 = (long)(int)local_200 * (long)loader.linear;
        (ttslot->metrics).horiAdvance =
             (long)(int)((ulong)((lVar18 >> 0x3f) + lVar18 + 0x8000) >> 0x10);
      }
      if ((ttslot->metrics).vertAdvance == 0) {
        if (loader.vadvance != 0) {
          lVar18 = (long)local_210 * (long)loader.vadvance;
          (ttslot->metrics).vertAdvance =
               (long)(int)((ulong)((lVar18 >> 0x3f) + lVar18 + 0x8000) >> 0x10);
          return 0;
        }
        return 0;
      }
      return 0;
    }
    uVar15 = ttslot->face->face_flags;
    if ((char)iVar12 == -99) {
      if ((uVar15 & 1) == 0) {
        loader.face._0_2_ = 0;
        _top_bearing = _top_bearing & 0xffffffffffff0000;
        _advance_width = _advance_width & 0xffffffffffff0000;
        advance_height = 0;
        if (face->horz_metrics_size != 0) {
          (**(code **)((long)face->sfnt + 0x140))(face,0,glyph_index,&loader,&advance_width);
          TT_Get_VMetrics(face,glyph_index,0,&top_bearing,&advance_height);
          (ttslot->outline).n_contours = 0;
          (ttslot->outline).n_points = 0;
          (ttslot->metrics).width = 0;
          (ttslot->metrics).height = 0;
          lVar18 = (long)(short)(ushort)loader.face * (long)(int)local_200;
          (ttslot->metrics).horiBearingX = lVar18 + 0x8000 + (lVar18 >> 0x3f) >> 0x10;
          (ttslot->metrics).horiBearingY = 0;
          lVar18 = (_advance_width & 0xffff) * (long)(int)local_200;
          (ttslot->metrics).horiAdvance = lVar18 + 0x8000 + (lVar18 >> 0x3f) >> 0x10;
          (ttslot->metrics).vertBearingX = 0;
          lVar18 = (long)top_bearing * (long)local_210;
          (ttslot->metrics).vertBearingY = lVar18 + 0x8000 + (lVar18 >> 0x3f) >> 0x10;
          lVar18 = (ulong)advance_height * (long)local_210;
          (ttslot->metrics).vertAdvance = lVar18 + 0x8000 + (lVar18 >> 0x3f) >> 0x10;
          ttslot->format = FT_GLYPH_FORMAT_BITMAP;
          (ttslot->bitmap).pixel_mode = '\x01';
          ttslot->bitmap_left = 0;
          ttslot->bitmap_top = 0;
          return 0;
        }
        return iVar12;
      }
    }
    else if ((uVar15 & 1) == 0) {
      return iVar12;
    }
  }
  if (((uint)load_flags >> 0xe & 1) != 0) {
    return 6;
  }
  if (((load_flags & 1U) == 0) && ((char)ttsize[2].metrics.ascender == '\0')) {
    return 0x24;
  }
  if ((((uint)load_flags >> 0x14 & 1) != 0) && (face->svg != (void *)0x0)) {
    pvVar4 = face->sfnt;
    iVar12 = (**(code **)((long)pvVar4 + 0x168))(ttslot,glyph_index);
    if (iVar12 == 0) {
      FVar23 = (ttsize->metrics).x_scale;
      FVar8 = (ttsize->metrics).y_scale;
      ttslot->format = FT_GLYPH_FORMAT_SVG;
      (**(code **)((long)pvVar4 + 0x140))(face,0,glyph_index,&loader,&advance_width);
      (**(code **)((long)pvVar4 + 0x140))(face,1,glyph_index,&top_bearing);
      ttslot->linearHoriAdvance = _advance_width & 0xffff;
      ttslot->linearVertAdvance = (ulong)advance_height;
      lVar18 = (long)(int)FVar23 * (_advance_width & 0xffff);
      (ttslot->metrics).horiAdvance = lVar18 + 0x8000 + (lVar18 >> 0x3f) >> 0x10;
      lVar18 = (long)(int)FVar8 * (ulong)advance_height;
      (ttslot->metrics).vertAdvance = lVar18 + 0x8000 + (lVar18 >> 0x3f) >> 0x10;
      return 0;
    }
  }
  if (((uint)load_flags >> 0x17 & 1) != 0) {
    return 6;
  }
  FVar13 = tt_loader_init(&loader,(TT_Size)ttsize,ttslot,load_flags,'\0');
  if (FVar13 != 0) {
    return FVar13;
  }
  if ((((uint)load_flags >> 8 & 1) != 0) &&
     (loader.widthp != (FT_Byte *)0x0 && (load_flags & 0x10U) == 0)) {
    (ttslot->metrics).horiAdvance = (ulong)loader.widthp[glyph_index] << 6;
    FVar13 = 0;
    goto LAB_00210f5e;
  }
  ttslot->format = FT_GLYPH_FORMAT_OUTLINE;
  ttslot->num_subglyphs = 0;
  (ttslot->outline).flags = 0;
  FVar13 = load_truetype_glyph(&loader,glyph_index,0,'\0');
  if (FVar13 == 0) {
    if (ttslot->format == FT_GLYPH_FORMAT_COMPOSITE) {
      ttslot->num_subglyphs = ((loader.gloader)->base).num_subglyphs;
      ttslot->subglyphs = ((loader.gloader)->base).subglyphs;
    }
    else {
      outline = &ttslot->outline;
      uVar9 = *(undefined4 *)&((loader.gloader)->base).outline.field_0x24;
      (ttslot->outline).flags = ((loader.gloader)->base).outline.flags;
      *(undefined4 *)&(ttslot->outline).field_0x24 = uVar9;
      sVar10 = ((loader.gloader)->base).outline.n_contours;
      sVar11 = ((loader.gloader)->base).outline.n_points;
      uVar9 = *(undefined4 *)&((loader.gloader)->base).outline.field_0x4;
      pFVar6 = ((loader.gloader)->base).outline.points;
      psVar3 = ((loader.gloader)->base).outline.contours;
      (ttslot->outline).tags = ((loader.gloader)->base).outline.tags;
      (ttslot->outline).contours = psVar3;
      outline->n_contours = sVar10;
      outline->n_points = sVar11;
      *(undefined4 *)&outline->field_0x4 = uVar9;
      (ttslot->outline).points = pFVar6;
      pbVar1 = (byte *)((long)&(ttslot->outline).flags + 1);
      *pbVar1 = *pbVar1 & 0xfd;
      if (loader.pp1.x != 0) {
        FT_Outline_Translate(outline,-loader.pp1.x,0);
      }
    }
    if ((load_flags & 2U) == 0) {
      uVar14 = 8;
      if (((loader.exec)->GS).scan_control != '\0') {
        switch(((loader.exec)->GS).scan_type) {
        case 0:
          uVar14 = 0x20;
          break;
        case 1:
          goto switchD_00210d02_caseD_1;
        case 4:
          uVar14 = 0x30;
          break;
        case 5:
          uVar14 = 0x10;
        }
      }
      piVar2 = &(ttslot->outline).flags;
      *piVar2 = *piVar2 | uVar14;
    }
switchD_00210d02_caseD_1:
    b_ = 0x10000;
    if (((byte)loader.load_flags & 1) == 0) {
      b_ = *(FT_Long *)
            (*(long *)(CONCAT26(loader.size._6_2_,
                                CONCAT24(loader.size._4_2_,
                                         CONCAT22(loader.size._2_2_,(ushort)loader.size))) + 0x58) +
            0x10);
    }
    lVar18 = CONCAT26(loader.face._6_2_,
                      CONCAT24(loader.face._4_2_,CONCAT22(loader.face._2_2_,(ushort)loader.face)));
    if ((loader.glyph)->format == FT_GLYPH_FORMAT_COMPOSITE) {
      local_1e8 = loader.bbox.xMax;
      lStack_1e0 = loader.bbox.yMax;
      _top_bearing = loader.bbox.xMin;
      lStack_1f0 = loader.bbox.yMin;
    }
    else {
      FT_Outline_Get_CBox(&(loader.glyph)->outline,(FT_BBox *)&top_bearing);
    }
    (loader.glyph)->linearHoriAdvance = (long)loader.linear;
    ((loader.glyph)->metrics).horiBearingX = _top_bearing;
    ((loader.glyph)->metrics).horiBearingY = lStack_1e0;
    if (loader.widthp == (FT_Byte *)0x0) {
      lVar19 = loader.pp2.x - loader.pp1.x;
    }
    else {
      lVar19 = (ulong)loader.widthp[glyph_index] << 6;
    }
    ((loader.glyph)->metrics).horiAdvance = lVar19;
    ((loader.glyph)->metrics).width = local_1e8 - _top_bearing;
    ((loader.glyph)->metrics).height = lStack_1e0 - lStack_1f0;
    if ((*(char *)(lVar18 + 0x1f0) == '\0') || (*(short *)(lVar18 + 0x21e) == 0)) {
      FVar17 = FT_DivFix(lStack_1e0 - lStack_1f0,b_);
      psVar3 = (short *)(lVar18 + 0x19a);
      psVar21 = (short *)(lVar18 + 0x198);
      if (*(short *)(lVar18 + 0x268) != -1) {
        psVar21 = (short *)(lVar18 + 0x2c2);
        psVar3 = (short *)(lVar18 + 0x2c4);
      }
      uVar15 = (long)*psVar21 - (long)*psVar3;
      FVar23 = (FT_Fixed)(((int)uVar15 - (int)(short)FVar17) / 2);
    }
    else {
      FVar17 = FT_DivFix(loader.pp3.y - lStack_1e0,b_);
      FVar23 = (FT_Fixed)(short)FVar17;
      if (loader.pp3.y - loader.pp4.y == 0 || loader.pp3.y < loader.pp4.y) {
        uVar15 = 0;
      }
      else {
        local_200 = FVar23;
        uVar15 = FT_DivFix(loader.pp3.y - loader.pp4.y,b_);
        uVar15 = uVar15 & 0xffff;
        FVar23 = local_200;
      }
    }
    plVar5 = *(long **)(*(long *)(lVar18 + 0xf0) + 0x68);
    if ((plVar5 != (long *)0x0) && (*(code **)(*plVar5 + 0x10) != (code *)0x0)) {
      _advance_width = 0;
      local_1c8 = FVar23;
      local_1c0 = uVar15;
      FVar13 = (**(code **)(*plVar5 + 0x10))(plVar5[1],glyph_index,1);
      uVar15 = local_1c0;
      FVar23 = local_1c8;
      if (FVar13 != 0) goto LAB_00210f46;
    }
    (loader.glyph)->linearVertAdvance = uVar15;
    if (((byte)loader.load_flags & 1) == 0) {
      local_210 = (int)b_;
      lVar18 = (long)(int)FVar23 * (long)local_210;
      FVar23 = (FT_Fixed)(int)((ulong)(lVar18 + 0x8000 + (lVar18 >> 0x3f)) >> 0x10);
      lVar18 = (long)(int)uVar15 * (long)local_210;
      uVar15 = (ulong)(int)((ulong)(lVar18 + 0x8000 + (lVar18 >> 0x3f)) >> 0x10);
    }
    ((loader.glyph)->metrics).vertBearingX =
         ((loader.glyph)->metrics).horiAdvance / -2 + ((loader.glyph)->metrics).horiBearingX;
    ((loader.glyph)->metrics).vertBearingY = FVar23;
    ((loader.glyph)->metrics).vertAdvance = uVar15;
    FVar13 = 0;
  }
LAB_00210f46:
  if (((load_flags & 1U) == 0) && (*(ushort *)((long)&(ttsize[1].face)->num_faces + 2) < 0x18)) {
    pbVar1 = (byte *)((long)&(ttslot->outline).flags + 1);
    *pbVar1 = *pbVar1 | 1;
  }
LAB_00210f5e:
  tt_loader_done(&loader);
  return FVar13;
}

Assistant:

static FT_Error
  tt_glyph_load( FT_GlyphSlot  ttslot,      /* TT_GlyphSlot */
                 FT_Size       ttsize,      /* TT_Size      */
                 FT_UInt       glyph_index,
                 FT_Int32      load_flags )
  {
    TT_GlyphSlot  slot = (TT_GlyphSlot)ttslot;
    TT_Size       size = (TT_Size)ttsize;
    FT_Face       face = ttslot->face;
    FT_Error      error;


    if ( !slot )
      return FT_THROW( Invalid_Slot_Handle );

    if ( !size )
      return FT_THROW( Invalid_Size_Handle );

    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

#ifdef FT_CONFIG_OPTION_INCREMENTAL
    if ( glyph_index >= (FT_UInt)face->num_glyphs &&
         !face->internal->incremental_interface   )
#else
    if ( glyph_index >= (FT_UInt)face->num_glyphs )
#endif
      return FT_THROW( Invalid_Argument );

    if ( load_flags & FT_LOAD_NO_HINTING )
    {
      /* both FT_LOAD_NO_HINTING and FT_LOAD_NO_AUTOHINT   */
      /* are necessary to disable hinting for tricky fonts */

      if ( FT_IS_TRICKY( face ) )
        load_flags &= ~FT_LOAD_NO_HINTING;

      if ( load_flags & FT_LOAD_NO_AUTOHINT )
        load_flags |= FT_LOAD_NO_HINTING;
    }

    if ( load_flags & ( FT_LOAD_NO_RECURSE | FT_LOAD_NO_SCALE ) )
    {
      load_flags |= FT_LOAD_NO_BITMAP | FT_LOAD_NO_SCALE;

      if ( !FT_IS_TRICKY( face ) )
        load_flags |= FT_LOAD_NO_HINTING;
    }

    /* use hinted metrics only if we load a glyph with hinting */
    size->metrics = ( load_flags & FT_LOAD_NO_HINTING )
                      ? &ttsize->metrics
                      : &size->hinted_metrics;

    /* now fill in the glyph slot with outline/bitmap/layered */
    error = TT_Load_Glyph( size, slot, glyph_index, load_flags );

    /* force drop-out mode to 2 - irrelevant now */
    /* slot->outline.dropout_mode = 2; */

    return error;
  }